

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UNormalizer2 * unorm2_getNFKDInstance_63(UErrorCode *pErrorCode)

{
  UNormalizer2 *pUVar1;
  long lVar2;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::umtx_initOnce<char_const*>
              ((UInitOnce *)&icu_63::nfkcInitOnce,icu_63::initSingletons,"nfkc",pErrorCode);
    lVar2 = icu_63::nfkcSingleton;
  }
  else {
    lVar2 = 0;
  }
  pUVar1 = (UNormalizer2 *)(lVar2 + 0x20);
  if (lVar2 == 0) {
    pUVar1 = (UNormalizer2 *)0x0;
  }
  return pUVar1;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }